

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

Amount __thiscall cfd::core::AbstractTransaction::GetValueOut(AbstractTransaction *this)

{
  CfdException *this_00;
  Amount AVar1;
  int ret;
  uint64_t satoshi;
  int local_4c;
  uint64_t local_48;
  undefined1 local_40 [32];
  
  local_48 = 0;
  local_4c = wally_tx_get_total_output_satoshi((wally_tx *)this->wally_tx_pointer_,&local_48);
  if (local_4c == 0) {
    AVar1 = Amount::CreateBySatoshiAmount(local_48);
    return AVar1;
  }
  local_40._0_8_ = "cfdcore_transaction_common.cpp";
  local_40._8_4_ = 0x262;
  local_40._16_8_ = "GetValueOut";
  logger::log<int&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                    "wally_tx_get_total_output_satoshi NG[{}].",&local_4c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"total output calc error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Amount AbstractTransaction::GetValueOut() const {
  uint64_t satoshi = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);

  int ret = wally_tx_get_total_output_satoshi(tx_pointer, &satoshi);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_total_output_satoshi NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "total output calc error.");
  }
  return Amount::CreateBySatoshiAmount(satoshi);
}